

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O3

void __thiscall Refal2::CQualifierBuilder::Export(CQualifierBuilder *this,CQualifier *qualifier)

{
  _WordT _Var1;
  bool bVar2;
  
  AddS(this);
  if (this->terms == S_None) {
    this->terms = this->negative + S_Yes;
  }
  qualifier->flags = 0;
  _Var1 = (this->ansichars).super__Base_bitset<2UL>._M_w[1];
  (qualifier->ansichars).super__Base_bitset<2UL>._M_w[0] =
       (this->ansichars).super__Base_bitset<2UL>._M_w[0];
  (qualifier->ansichars).super__Base_bitset<2UL>._M_w[1] = _Var1;
  if (this->terms == S_Yes) {
    qualifier->flags = 1;
  }
  bVar2 = CSetBuilder<char>::Export(&this->charsBuilder,&qualifier->chars);
  if (bVar2) {
    *(byte *)&qualifier->flags = (byte)qualifier->flags | 2;
  }
  bVar2 = CSetBuilder<int>::Export(&this->labelsBuilder,&qualifier->labels);
  if (bVar2) {
    *(byte *)&qualifier->flags = (byte)qualifier->flags | 4;
  }
  bVar2 = CSetBuilder<unsigned_int>::Export(&this->numbersBuilder,&qualifier->numbers);
  if (bVar2) {
    *(byte *)&qualifier->flags = (byte)qualifier->flags | 8;
  }
  return;
}

Assistant:

void CQualifierBuilder::Export( CQualifier& qualifier )
{
	AddW();
	qualifier.flags = 0;
	qualifier.ansichars = ansichars;
	if( terms == S_Yes ) {
		qualifier.flags |= QIF_Terms;
	}
	if( charsBuilder.Export( qualifier.chars ) ) {
		qualifier.flags |= QIF_AllChars;
	}
	if( labelsBuilder.Export( qualifier.labels ) ) {
		qualifier.flags |= QIF_AllLabels;
	}
	if( numbersBuilder.Export( qualifier.numbers ) ) {
		qualifier.flags |= QIF_AllNumbers;
	}
}